

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::remap_pls_variables(CompilerGLSL *this)

{
  pointer pPVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  runtime_error *prVar4;
  pointer pPVar5;
  bool bVar6;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pPVar5 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar1 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_finish;
  while( true ) {
    if (pPVar5 == pPVar1) {
      pPVar5 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (pPVar5 == pPVar1) {
          return;
        }
        pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + pPVar5->id);
        if (pSVar2->storage != StorageClassOutput) break;
        pSVar2->remapped_variable = true;
        pPVar5 = pPVar5 + 1;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Can only use out variables for PLS outputs.","");
      ::std::runtime_error::runtime_error(prVar4,(string *)local_48);
      *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        pPVar5->id);
    if (pSVar2->storage == StorageClassUniformConstant) {
      pSVar3 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar2->super_IVariant).field_0xc);
      bVar6 = (pSVar3->image).dim == DimSubpassData;
    }
    else {
      bVar6 = false;
    }
    if ((pSVar2->storage != StorageClassInput) && (!bVar6)) break;
    pSVar2->remapped_variable = true;
    pPVar5 = pPVar5 + 1;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Can only use in and target variables for PLS inputs.","");
  ::std::runtime_error::runtime_error(prVar4,(string *)local_48);
  *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
  __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::remap_pls_variables()
{
	for (auto &input : pls_inputs)
	{
		auto &var = get<SPIRVariable>(input.id);

		bool input_is_target = false;
		if (var.storage == StorageClassUniformConstant)
		{
			auto &type = get<SPIRType>(var.basetype);
			input_is_target = type.image.dim == DimSubpassData;
		}

		if (var.storage != StorageClassInput && !input_is_target)
			SPIRV_CROSS_THROW("Can only use in and target variables for PLS inputs.");
		var.remapped_variable = true;
	}

	for (auto &output : pls_outputs)
	{
		auto &var = get<SPIRVariable>(output.id);
		if (var.storage != StorageClassOutput)
			SPIRV_CROSS_THROW("Can only use out variables for PLS outputs.");
		var.remapped_variable = true;
	}
}